

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_ls.c
# Opt level: O0

int arkLsDenseDQJac(sunrealtype t,N_Vector y,N_Vector fy,SUNMatrix Jac,ARKodeMem ark_mem,
                   ARKLsMem arkls_mem,ARKRhsFn fi,N_Vector tmp1)

{
  double dVar1;
  double dVar2;
  sunindextype sVar3;
  undefined8 uVar4;
  long lVar5;
  long lVar6;
  sunrealtype *psVar7;
  long in_RCX;
  SUNMatrix in_RDX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  long in_R8;
  code *in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_stack_00000008;
  int retval;
  sunindextype N;
  sunindextype j;
  N_Vector jthCol;
  N_Vector ftemp;
  sunrealtype *cns_data;
  sunrealtype *ewt_data;
  sunrealtype *y_data;
  sunrealtype conj;
  sunrealtype srur;
  sunrealtype yjsaved;
  sunrealtype inc_inv;
  sunrealtype inc;
  sunrealtype minInc;
  sunrealtype fnorm;
  double local_d0;
  double local_c8;
  double local_c0;
  long local_b8;
  int local_ac;
  long local_a0;
  double local_50;
  
  local_ac = 0;
  sVar3 = SUNDenseMatrix_Columns(in_RDX);
  uVar4 = N_VCloneEmpty(in_stack_00000008);
  lVar5 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 0x210));
  lVar6 = N_VGetArrayPointer(in_RDI);
  if (*(int *)(in_RCX + 0x80) == 0) {
    local_b8 = 0;
  }
  else {
    local_b8 = N_VGetArrayPointer(*(undefined8 *)(in_RCX + 0x270));
  }
  if (0.0 < *(double *)(in_RCX + 8)) {
    local_c0 = sqrt(*(double *)(in_RCX + 8));
  }
  else {
    local_c0 = 0.0;
  }
  local_c8 = (double)N_VWrmsNorm(in_RSI,*(undefined8 *)(in_RCX + 0x218));
  if ((local_c8 != 0.0) || (NAN(local_c8))) {
    local_c8 = ABS(*(double *)(in_RCX + 0x2a0)) * 1000.0 * *(double *)(in_RCX + 8) * (double)sVar3 *
               local_c8;
  }
  else {
    local_c8 = 1.0;
  }
  for (local_a0 = 0; local_a0 < sVar3; local_a0 = local_a0 + 1) {
    psVar7 = SUNDenseMatrix_Column(in_RDX,local_a0);
    N_VSetArrayPointer(psVar7,uVar4);
    dVar1 = *(double *)(lVar6 + local_a0 * 8);
    if (local_c0 * ABS(dVar1) <= local_c8 / *(double *)(lVar5 + local_a0 * 8)) {
      local_d0 = local_c8 / *(double *)(lVar5 + local_a0 * 8);
    }
    else {
      local_d0 = local_c0 * ABS(dVar1);
    }
    local_50 = local_d0;
    if (*(int *)(in_RCX + 0x80) != 0) {
      dVar2 = *(double *)(local_b8 + local_a0 * 8);
      if ((ABS(dVar2) != 1.0) || (NAN(ABS(dVar2)))) {
        if ((ABS(dVar2) == 2.0) && ((!NAN(ABS(dVar2)) && ((dVar1 + local_d0) * dVar2 <= 0.0)))) {
          local_50 = -local_d0;
        }
      }
      else if ((dVar1 + local_d0) * dVar2 < 0.0) {
        local_50 = -local_d0;
      }
    }
    *(double *)(lVar6 + local_a0 * 8) = local_50 + *(double *)(lVar6 + local_a0 * 8);
    local_ac = (*in_R9)(in_XMM0_Qa,in_RDI,in_stack_00000008,*(undefined8 *)(in_RCX + 0x10));
    *(long *)(in_R8 + 0x88) = *(long *)(in_R8 + 0x88) + 1;
    if (local_ac != 0) break;
    *(double *)(lVar6 + local_a0 * 8) = dVar1;
    N_VLinearSum(1.0 / local_50,-(1.0 / local_50),in_stack_00000008,in_RSI,uVar4);
  }
  N_VSetArrayPointer(0,uVar4);
  N_VDestroy(uVar4);
  return local_ac;
}

Assistant:

int arkLsDenseDQJac(sunrealtype t, N_Vector y, N_Vector fy, SUNMatrix Jac,
                    ARKodeMem ark_mem, ARKLsMem arkls_mem, ARKRhsFn fi,
                    N_Vector tmp1)
{
  sunrealtype fnorm, minInc, inc, inc_inv, yjsaved, srur, conj;
  sunrealtype *y_data, *ewt_data, *cns_data;
  N_Vector ftemp, jthCol;
  sunindextype j, N;
  int retval = 0;

  /* access matrix dimension */
  N = SUNDenseMatrix_Columns(Jac);

  /* Rename work vector for readibility */
  ftemp = tmp1;

  /* Create an empty vector for matrix column calculations */
  jthCol = N_VCloneEmpty(tmp1);

  /* Obtain pointers to the data for various vectors */
  ewt_data = N_VGetArrayPointer(ark_mem->ewt);
  y_data   = N_VGetArrayPointer(y);
  cns_data = (ark_mem->constraintsSet) ? N_VGetArrayPointer(ark_mem->constraints)
                                       : NULL;

  /* Set minimum increment based on uround and norm of f */
  srur   = SUNRsqrt(ark_mem->uround);
  fnorm  = N_VWrmsNorm(fy, ark_mem->rwt);
  minInc = (fnorm != ZERO)
             ? (MIN_INC_MULT * SUNRabs(ark_mem->h) * ark_mem->uround * N * fnorm)
             : ONE;

  for (j = 0; j < N; j++)
  {
    /* Generate the jth col of J(tn,y) */
    N_VSetArrayPointer(SUNDenseMatrix_Column(Jac, j), jthCol);

    yjsaved = y_data[j];
    inc     = SUNMAX(srur * SUNRabs(yjsaved), minInc / ewt_data[j]);

    /* Adjust sign(inc) if y_j has an inequality constraint. */
    if (ark_mem->constraintsSet)
    {
      conj = cns_data[j];
      if (SUNRabs(conj) == ONE)
      {
        if ((yjsaved + inc) * conj < ZERO) { inc = -inc; }
      }
      else if (SUNRabs(conj) == TWO)
      {
        if ((yjsaved + inc) * conj <= ZERO) { inc = -inc; }
      }
    }

    y_data[j] += inc;

    retval = fi(t, y, ftemp, ark_mem->user_data);
    arkls_mem->nfeDQ++;
    if (retval != 0) { break; }

    y_data[j] = yjsaved;

    inc_inv = ONE / inc;
    N_VLinearSum(inc_inv, ftemp, -inc_inv, fy, jthCol);
  }

  /* Destroy jthCol vector */
  N_VSetArrayPointer(NULL, jthCol); /* SHOULDN'T BE NEEDED */
  N_VDestroy(jthCol);

  return (retval);
}